

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verCore.c
# Opt level: O0

void Ver_ParsePrintLog(Ver_Man_t *pMan)

{
  Abc_Obj_t *pAVar1;
  Abc_Ntk_t *pAVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  char *pcVar6;
  FILE *__stream;
  void *pvVar7;
  Abc_Ntk_t *pAVar8;
  Abc_Obj_t *pAVar9;
  char *pcVar10;
  char *pcVar11;
  uint local_454;
  uint local_450;
  int Counter;
  int nActNets;
  int j;
  Ver_Bundle_t *pBundle;
  Vec_Ptr_t *vBundles;
  int local_430;
  int Count1;
  int k;
  int i;
  char Buffer [1000];
  char *pNameGeneric;
  FILE *pFile;
  Abc_Obj_t *pBox;
  Abc_Ntk_t *pNtkBox;
  Abc_Ntk_t *pNtk;
  Ver_Man_t *pMan_local;
  
  vBundles._4_4_ = 0;
  pcVar6 = Extra_FileNameGeneric(pMan->pFileName);
  sprintf((char *)&k,"%s.log",pcVar6);
  if (pcVar6 != (char *)0x0) {
    free(pcVar6);
  }
  __stream = fopen((char *)&k,"w");
  for (Count1 = 0; iVar3 = Vec_PtrSize(pMan->pDesign->vModules), Count1 < iVar3; Count1 = Count1 + 1
      ) {
    pvVar7 = Vec_PtrEntry(pMan->pDesign->vModules,Count1);
    *(undefined4 *)((long)pvVar7 + 0xc0) = 0;
  }
  for (Count1 = 0; iVar3 = Vec_PtrSize(pMan->pDesign->vModules), Count1 < iVar3; Count1 = Count1 + 1
      ) {
    pAVar8 = (Abc_Ntk_t *)Vec_PtrEntry(pMan->pDesign->vModules,Count1);
    for (local_430 = 0; iVar3 = Vec_PtrSize(pAVar8->vBoxes), local_430 < iVar3;
        local_430 = local_430 + 1) {
      pAVar9 = Abc_NtkBox(pAVar8,local_430);
      iVar3 = Abc_ObjIsLatch(pAVar9);
      if ((iVar3 == 0) && (pvVar7 = (pAVar9->field_5).pData, pvVar7 != (void *)0x0)) {
        *(int *)((long)pvVar7 + 0xc0) = *(int *)((long)pvVar7 + 0xc0) + 1;
      }
    }
  }
  pcVar6 = pMan->pFileName;
  uVar4 = Vec_PtrSize(pMan->pDesign->vModules);
  fprintf(__stream,"The hierarhical design %s contains %d modules:\n",pcVar6,(ulong)uVar4);
  for (Count1 = 0; iVar3 = Vec_PtrSize(pMan->pDesign->vModules), Count1 < iVar3; Count1 = Count1 + 1
      ) {
    pAVar8 = (Abc_Ntk_t *)Vec_PtrEntry(pMan->pDesign->vModules,Count1);
    pcVar6 = Abc_NtkName(pAVar8);
    fprintf(__stream,"%-50s : ",pcVar6);
    iVar3 = Ver_NtkIsDefined(pAVar8);
    if (iVar3 == 0) {
      fprintf(__stream,"undefbox");
    }
    else {
      iVar3 = Abc_NtkHasBlackbox(pAVar8);
      if (iVar3 == 0) {
        fprintf(__stream,"logicbox");
      }
      else {
        fprintf(__stream,"blackbox");
      }
    }
    fprintf(__stream," instantiated %6d times ",(ulong)(uint)pAVar8->fHieVisited);
    uVar4 = Abc_NtkPiNum(pAVar8);
    fprintf(__stream," pi = %4d",(ulong)uVar4);
    uVar4 = Abc_NtkPoNum(pAVar8);
    fprintf(__stream," po = %4d",(ulong)uVar4);
    uVar4 = Abc_NtkNodeNum(pAVar8);
    fprintf(__stream," nd = %8d",(ulong)uVar4);
    uVar4 = Abc_NtkLatchNum(pAVar8);
    fprintf(__stream," lat = %6d",(ulong)uVar4);
    iVar3 = Abc_NtkBoxNum(pAVar8);
    iVar5 = Abc_NtkLatchNum(pAVar8);
    fprintf(__stream," box = %6d",(ulong)(uint)(iVar3 - iVar5));
    fprintf(__stream,"\n");
    iVar3 = Abc_NtkPoNum(pAVar8);
    vBundles._4_4_ = (iVar3 == 1) + vBundles._4_4_;
  }
  for (Count1 = 0; iVar3 = Vec_PtrSize(pMan->pDesign->vModules), Count1 < iVar3; Count1 = Count1 + 1
      ) {
    pvVar7 = Vec_PtrEntry(pMan->pDesign->vModules,Count1);
    *(undefined4 *)((long)pvVar7 + 0xc0) = 0;
  }
  iVar3 = Vec_PtrSize(pMan->pDesign->vModules);
  fprintf(__stream,"The number of modules with one output = %d (%.2f %%).\n",
          ((double)(int)vBundles._4_4_ * 100.0) / (double)iVar3,(ulong)vBundles._4_4_);
  iVar3 = Vec_PtrSize(pMan->pDesign->vModules);
  if (1 < iVar3) {
    local_454 = 0;
    for (Count1 = 0; iVar3 = Vec_PtrSize(pMan->pDesign->vModules), Count1 < iVar3;
        Count1 = Count1 + 1) {
      pAVar8 = (Abc_Ntk_t *)Vec_PtrEntry(pMan->pDesign->vModules,Count1);
      for (local_430 = 0; iVar3 = Vec_PtrSize(pAVar8->vBoxes), local_430 < iVar3;
          local_430 = local_430 + 1) {
        pAVar9 = Abc_NtkBox(pAVar8,local_430);
        iVar3 = Abc_ObjIsLatch(pAVar9);
        if (iVar3 == 0) {
          pAVar1 = (pAVar9->field_6).pCopy;
          pAVar2 = (Abc_Ntk_t *)(pAVar9->field_5).pData;
          if ((pAVar2 != (Abc_Ntk_t *)0x0) && (iVar3 = Ver_NtkIsDefined(pAVar2), iVar3 != 0)) {
            local_450 = 0;
            for (Counter = 0; iVar3 = Vec_PtrSize((Vec_Ptr_t *)pAVar1), Counter < iVar3;
                Counter = Counter + 1) {
              pvVar7 = Vec_PtrEntry((Vec_Ptr_t *)pAVar1,Counter);
              iVar3 = Vec_PtrSize(*(Vec_Ptr_t **)((long)pvVar7 + 8));
              local_450 = iVar3 + local_450;
            }
            iVar3 = Abc_NtkPiNum(pAVar2);
            iVar5 = Abc_NtkPoNum(pAVar2);
            if (local_450 != iVar3 + iVar5) {
              local_454 = local_454 + 1;
            }
          }
        }
      }
    }
    if (local_454 == 0) {
      fprintf(__stream,"The outputs of all box instances are connected.\n");
    }
    else {
      fprintf(__stream,"\n");
      fprintf(__stream,"The outputs of %d box instances are not connected:\n",(ulong)local_454);
      for (Count1 = 0; iVar3 = Vec_PtrSize(pMan->pDesign->vModules), Count1 < iVar3;
          Count1 = Count1 + 1) {
        pAVar8 = (Abc_Ntk_t *)Vec_PtrEntry(pMan->pDesign->vModules,Count1);
        for (local_430 = 0; iVar3 = Vec_PtrSize(pAVar8->vBoxes), local_430 < iVar3;
            local_430 = local_430 + 1) {
          pAVar9 = Abc_NtkBox(pAVar8,local_430);
          iVar3 = Abc_ObjIsLatch(pAVar9);
          if (iVar3 == 0) {
            pAVar1 = (pAVar9->field_6).pCopy;
            pAVar2 = *(Abc_Ntk_t **)&(pAVar9->field_5).iData;
            if ((pAVar2 != (Abc_Ntk_t *)0x0) && (iVar3 = Ver_NtkIsDefined(pAVar2), iVar3 != 0)) {
              local_450 = 0;
              for (Counter = 0; iVar3 = Vec_PtrSize((Vec_Ptr_t *)pAVar1), Counter < iVar3;
                  Counter = Counter + 1) {
                pvVar7 = Vec_PtrEntry((Vec_Ptr_t *)pAVar1,Counter);
                iVar3 = Vec_PtrSize(*(Vec_Ptr_t **)((long)pvVar7 + 8));
                local_450 = iVar3 + local_450;
              }
              iVar3 = Abc_NtkPiNum(pAVar2);
              iVar5 = Abc_NtkPoNum(pAVar2);
              if (local_450 != iVar3 + iVar5) {
                pcVar6 = Abc_NtkName(pAVar8);
                pcVar10 = Abc_ObjName(pAVar9);
                pcVar11 = Abc_NtkName(pAVar2);
                iVar3 = Abc_NtkPiNum(pAVar2);
                iVar5 = Abc_NtkPoNum(pAVar2);
                fprintf(__stream,
                        "In module \"%s\" instance \"%s\" of box \"%s\" has different numbers of actual/formal nets (%d/%d).\n"
                        ,pcVar6,pcVar10,pcVar11,(ulong)local_450,iVar3 + iVar5);
              }
            }
          }
        }
      }
    }
  }
  fclose(__stream);
  printf("Hierarchy statistics can be found in log file \"%s\".\n",&k);
  return;
}

Assistant:

void Ver_ParsePrintLog( Ver_Man_t * pMan )
{
    Abc_Ntk_t * pNtk, * pNtkBox;
    Abc_Obj_t * pBox;
    FILE * pFile;
    char * pNameGeneric;
    char Buffer[1000];
    int i, k, Count1 = 0;

    // open the log file
    pNameGeneric = Extra_FileNameGeneric( pMan->pFileName );
    sprintf( Buffer, "%s.log", pNameGeneric );
    ABC_FREE( pNameGeneric );
    pFile = fopen( Buffer, "w" );

    // count the total number of instances and how many times they occur
    Vec_PtrForEachEntry( Abc_Ntk_t *, pMan->pDesign->vModules, pNtk, i )
        pNtk->fHieVisited = 0;
    Vec_PtrForEachEntry( Abc_Ntk_t *, pMan->pDesign->vModules, pNtk, i )
        Abc_NtkForEachBox( pNtk, pBox, k )
        {
            if ( Abc_ObjIsLatch(pBox) )
                continue;
            pNtkBox = (Abc_Ntk_t *)pBox->pData;
            if ( pNtkBox == NULL )
                continue;
            pNtkBox->fHieVisited++;
        }